

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookie.cpp
# Opt level: O1

QDebug operator<<(QDebug s,QNetworkCookie *cookie)

{
  QNetworkCookiePrivate *pQVar1;
  long *plVar2;
  QNetworkCookie *in_RDX;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QDebugStateSaver saver;
  undefined1 *local_50;
  QByteArray local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_50,(QDebug *)cookie);
  plVar2 = (long *)QDebug::resetFormat();
  *(undefined1 *)(*plVar2 + 0x30) = 0;
  pQVar1 = (cookie->d).d.ptr;
  QVar3.m_data = (storage_type *)0xf;
  QVar3.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar3);
  QTextStream::operator<<((QTextStream *)pQVar1,(QString *)&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar1 = (cookie->d).d.ptr;
  if (*(char *)&(pQVar1->path).d.ptr == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar1,' ');
  }
  QNetworkCookie::toRawForm(&local_48,in_RDX,Full);
  if (local_48.d.ptr == (char *)0x0) {
    local_48.d.ptr = (char *)&QByteArray::_empty;
  }
  QDebug::putByteArray((char *)cookie,(ulong)local_48.d.ptr,(Latin1Content)local_48.d.size);
  pQVar1 = (cookie->d).d.ptr;
  if (*(char *)&(pQVar1->path).d.ptr == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar1,' ');
  }
  QTextStream::operator<<((QTextStream *)(cookie->d).d.ptr,')');
  pQVar1 = (cookie->d).d.ptr;
  if (*(char *)&(pQVar1->path).d.ptr == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar1,' ');
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
    }
  }
  pQVar1 = (cookie->d).d.ptr;
  (cookie->d).d.ptr = (QNetworkCookiePrivate *)0x0;
  *(QNetworkCookiePrivate **)s.stream = pQVar1;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebug)s.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug s, const QNetworkCookie &cookie)
{
    QDebugStateSaver saver(s);
    s.resetFormat().nospace();
    s << "QNetworkCookie(" << cookie.toRawForm(QNetworkCookie::Full) << ')';
    return s;
}